

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  string buffer;
  string xml;
  Raytracer rt;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [16];
  string local_188;
  string local_168;
  string local_148 [32];
  string local_128;
  Raytracer local_108;
  
  std::__cxx11::string::string(local_148,"example2.xml",(allocator *)&local_108);
  local_1a8 = local_198;
  local_1a0 = 0;
  local_198[0] = 0;
  std::__cxx11::string::string((string *)&local_168,local_148);
  Raytracer::Raytracer(&local_108,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  Raytracer::start_abi_cxx11_(&local_128,&local_108);
  std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string((string *)&local_188,(string *)&local_1a8);
  Raytracer::writePPM(&local_108,&local_188,(int)local_1a0);
  std::__cxx11::string::~string((string *)&local_188);
  Raytracer::~Raytracer(&local_108);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string(local_148);
  return 0;
}

Assistant:

int main() {
    std::string xml="example2.xml";
    std::string buffer;
    int imgWidth=512;
    int imgHeight=512;

    Raytracer rt(xml);

    buffer=rt.start();
    rt.writePPM(buffer, buffer.size());

    return 0;
}